

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_bind(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  char *in_RSI;
  int in_EDI;
  sockaddr_in sin;
  sockaddr local_20;
  char *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  memset(&local_20,0,0x10);
  local_20.sa_family = 2;
  if (local_10 == (char *)0x0) {
    local_20.sa_data[0] = '\0';
    local_20.sa_data[1] = '\0';
    local_20.sa_data[2] = '\0';
    local_20.sa_data[3] = '\0';
    local_20.sa_data[4] = '\0';
    local_20.sa_data[5] = '\0';
  }
  else {
    local_20.sa_data._0_2_ = htons(*(uint16_t *)(local_10 + 4));
    local_20.sa_data._2_4_ = *(undefined4 *)local_10;
  }
  iVar1 = bind(local_4,&local_20,0x10);
  return iVar1;
}

Assistant:

int
enet_socket_bind (ENetSocket socket, const ENetAddress * address)
{
    struct sockaddr_in sin;

    memset (& sin, 0, sizeof (struct sockaddr_in));

    sin.sin_family = AF_INET;

    if (address != NULL)
    {
       sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
       sin.sin_addr.s_addr = address -> host;
    }
    else
    {
       sin.sin_port = 0;
       sin.sin_addr.s_addr = INADDR_ANY;
    }

    return bind (socket,
                 (struct sockaddr *) & sin,
                 sizeof (struct sockaddr_in)); 
}